

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O0

void vocdelinh(voccxdef *ctx)

{
  uint uVar1;
  vocwdef vVar2;
  bool bVar3;
  long in_RDI;
  vocwdef *local_78;
  vocwdef *local_60;
  int deleted_vocdef;
  uint nxtidx;
  uint idx;
  vocwdef *nxtw;
  vocwdef *prvw;
  vocwdef *vw;
  vocdef **vp;
  vocdef *nxt;
  vocdef *prv;
  vocdef *v;
  int i;
  
  vw = (vocwdef *)(in_RDI + 0x670);
  for (v._4_4_ = 0x100; v._4_4_ != 0; v._4_4_ = v._4_4_ + -1) {
    nxt = (vocdef *)0x0;
    vVar2 = *vw;
    while (prv = (vocdef *)vVar2, prv != (vocdef *)0x0) {
      vVar2 = (vocwdef)prv->vocnxt;
      bVar3 = false;
      nxtw = (vocwdef *)0x0;
      deleted_vocdef = prv->vocwlst;
      if (deleted_vocdef == 0xffffffff) {
        local_60 = (vocwdef *)0x0;
      }
      else {
        local_60 = (vocwdef *)
                   (*(long *)(in_RDI + 0xe70 + ((ulong)(uint)deleted_vocdef / 2000) * 8) +
                   ((ulong)(uint)deleted_vocdef % 2000) * 8);
      }
      prvw = local_60;
      while (prvw != (vocwdef *)0x0) {
        uVar1 = prvw->vocwnxt;
        if (uVar1 == 0xffffffff) {
          local_78 = (vocwdef *)0x0;
        }
        else {
          local_78 = (vocwdef *)
                     (*(long *)(in_RDI + 0xe70 + ((ulong)uVar1 / 2000) * 8) +
                     ((ulong)uVar1 % 2000) * 8);
        }
        if ((prvw->vocwflg & 2) == 0) {
          nxtw = prvw;
        }
        else {
          if (nxtw == (vocwdef *)0x0) {
            prv->vocwlst = prvw->vocwnxt;
          }
          else {
            nxtw->vocwnxt = prvw->vocwnxt;
          }
          prvw->vocwnxt = *(uint *)(in_RDI + 0xef4);
          *(int *)(in_RDI + 0xef4) = deleted_vocdef;
          if (prv->vocwlst == 0xffffffff) {
            if (nxt == (vocdef *)0x0) {
              *vw = (vocwdef)prv->vocnxt;
            }
            else {
              nxt->vocnxt = prv->vocnxt;
            }
            prv->vocnxt = *(vocdef **)(in_RDI + 0x30);
            *(vocdef **)(in_RDI + 0x30) = prv;
            bVar3 = true;
          }
        }
        deleted_vocdef = uVar1;
        prvw = local_78;
      }
      if (!bVar3) {
        nxt = prv;
      }
    }
    vw = vw + 1;
  }
  return;
}

Assistant:

void vocdelinh(voccxdef *ctx)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      idx;
    uint      nxtidx;
    int       deleted_vocdef;
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            nxt = v->vocnxt;
            deleted_vocdef = FALSE;

            /* go through each vocwdef relation in the word's list */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember the next item in the vocwdef list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /* delete word if it's inherited */
                if (vw->vocwflg & VOCFINH)
                {
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        /* unlink from hash chain */
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                        
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                    prvw = vw;  /* this one is still in list - it's now prv */
            }

            /* if we didn't delete this vocdef, advance prv onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}